

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O3

void __thiscall
cppcms::mount_point::mount_point
          (mount_point *this,selection_type sel,regex *http_host,regex *script,regex *path,int group
          )

{
  booster::regex::regex(&this->host_,http_host);
  booster::regex::regex(&this->script_name_,script);
  booster::regex::regex(&this->path_info_,path);
  this->group_ = group;
  this->selection_ = sel;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

mount_point::mount_point(	selection_type sel,
				booster::regex const &http_host,
				booster::regex const &script,
				booster::regex const &path,
				int group) 
	:	host_(http_host),
		script_name_(script),
		path_info_(path),
		group_(group),
		selection_(sel)
{
}